

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O3

vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *
Jinx::Impl::ParseRow
          (vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *__return_storage_ptr__,
          char delimiter,NumericFormat format,char **current,char *end)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *end_00;
  String str;
  Variant val;
  String local_78;
  Variant local_58;
  
  (__return_storage_ptr__->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  end_00 = end;
  do {
    if (*current == end) {
      return __return_storage_ptr__;
    }
    ParseCell_abi_cxx11_
              (&local_78,(Impl *)(ulong)(uint)(int)delimiter,(char)current,(char **)end,end_00);
    ParseValue(&local_58,&local_78,format);
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
              (__return_storage_ptr__,&local_58);
    pcVar3 = *current;
    bVar2 = true;
    if (pcVar3 != end) {
      cVar1 = *pcVar3;
      if (cVar1 != delimiter) {
        if ((cVar1 != '\r') && (cVar1 != '\n')) goto LAB_001f3ae6;
        if ((pcVar3[1] == '\r') || (pcVar3[1] == '\n')) {
          pcVar3 = pcVar3 + 1;
          *current = pcVar3;
        }
      }
      *current = pcVar3 + 1;
      bVar2 = cVar1 == delimiter;
    }
LAB_001f3ae6:
    Variant::~Variant(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      MemFree(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

inline_t std::vector<Variant, Jinx::Allocator<Variant>> ParseRow(char delimiter, NumericFormat format, const char ** current, const char * end)
	{
		std::vector<Variant, Jinx::Allocator<Variant>> variants;

		while (*current != end)
		{
			auto str = ParseCell(delimiter, current, end);
			auto val = ParseValue(str, format);
			variants.push_back(val);
			if (*current != end)
			{
				if (**current == delimiter)
				{
					++(*current);
				}
				else if (IsLineEnd(**current))
				{
					if (*current != end)
					{
						const char nc = *((*current) + 1);
						if (IsLineEnd(nc))
							++(*current);
					}
					++(*current);
					break;
				}
			}
		}

		return variants;
	}